

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O3

void conv_fmt_16bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                     int src_stridec,int *dst_stride,int uv_shift)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uchar *puVar6;
  uint uVar7;
  
  if (0 < height) {
    iVar2 = *dst_stride;
    puVar6 = *dst;
    iVar3 = height;
    do {
      memcpy(puVar6,src_y,(long)(width * 2));
      puVar6 = puVar6 + (long)(iVar2 >> 1) * 2;
      src_y = src_y + (long)(src_stride >> 1) * 2;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  uVar7 = width >> ((byte)uv_shift & 0x1f);
  iVar2 = height >> ((byte)uv_shift & 0x1f);
  if (0 < iVar2) {
    iVar3 = dst_stride[1];
    puVar1 = dst[1];
    iVar4 = 0;
    puVar6 = src_uv;
    do {
      if (0 < (int)uVar7) {
        lVar5 = 0;
        do {
          *(undefined2 *)(puVar1 + lVar5) = *(undefined2 *)(puVar6 + (long)(int)lVar5 * 2);
          lVar5 = lVar5 + 2;
        } while ((ulong)uVar7 * 2 != lVar5);
      }
      puVar6 = puVar6 + (long)(src_stridec >> 1) * 2;
      iVar4 = iVar4 + 1;
      puVar1 = puVar1 + (long)(iVar3 >> 1) * 2;
    } while (iVar4 != iVar2);
    if (0 < iVar2) {
      iVar3 = dst_stride[2];
      puVar1 = dst[2];
      puVar6 = src_uv + 2;
      iVar4 = 0;
      do {
        if (0 < (int)uVar7) {
          lVar5 = 0;
          do {
            *(undefined2 *)(puVar1 + lVar5) = *(undefined2 *)(puVar6 + (long)(int)lVar5 * 2);
            lVar5 = lVar5 + 2;
          } while ((ulong)uVar7 * 2 != lVar5);
        }
        puVar6 = puVar6 + (long)(src_stridec >> 1) * 2;
        iVar4 = iVar4 + 1;
        puVar1 = puVar1 + (long)(iVar3 >> 1) * 2;
      } while (iVar4 != iVar2);
    }
  }
  return;
}

Assistant:

static void conv_fmt_16bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    short* psrc = (short*)src_y;
    short* pdst = (short*)dst[0];
    int width2 = width << 1;
    int i_src = src_stride >> 1;
    int i_dst = dst_stride[0] >> 1;

    for (i = 0; i < height; i++) {
        memcpy(pdst, psrc, width2);
        psrc += i_src;
        pdst += i_dst;
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = (short*)src_uv;
    pdst = (short*)dst[1];
    i_src = src_stridec >> 1;
    i_dst = dst_stride[1] >> 1;
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    psrc = ((short*)src_uv) + 1;
    pdst = (short*)dst[2];
    i_dst = dst_stride[2] >> 1;
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }
}